

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

void __thiscall cmFortranParser_s::~cmFortranParser_s(cmFortranParser_s *this)

{
  cmFortran_yylex_destroy(this->Scanner);
  std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base
            ((_Deque_base<bool,_std::allocator<bool>_> *)&this->SkipToEnd);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->PPDefinitions)._M_t);
  std::__cxx11::string::~string((string *)&this->Error);
  std::__cxx11::string::~string((string *)&this->TokenString);
  std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::~deque(&(this->FileStack).c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->IncludePath);
  cmFortranCompiler::~cmFortranCompiler(&this->Compiler);
  return;
}

Assistant:

cmFortranParser_s::~cmFortranParser_s()
{
  cmFortran_yylex_destroy(this->Scanner);
}